

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamPushInternal(xmlStreamCtxtPtr stream,xmlChar *name,xmlChar *ns,int nodeType)

{
  uint uVar1;
  int iVar2;
  xmlStreamCompPtr pxVar3;
  int *piVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  xmlStreamStepPtr pxVar10;
  _xmlStreamCtxt *comp;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  
  uVar13 = 0xffffffff;
  if ((stream != (xmlStreamCtxtPtr)0x0) && (-1 < stream->nbState)) {
    iVar12 = 0;
    uVar13 = 0;
    do {
      uVar14 = 0;
      comp = stream;
      uVar18 = uVar13;
      while (pxVar3 = comp->comp, ns != (xmlChar *)0x0 || (name != (xmlChar *)0x0 || nodeType != 1))
      {
        if (pxVar3->nbStep == 0) {
          if ((comp->flags & 1U) != 0) goto LAB_0016b55f;
          if ((nodeType != 2) && (((comp->flags & 6U) == 0 || (comp->level == 0)))) {
            uVar18 = 1;
          }
LAB_0016b828:
          comp->level = comp->level + 1;
        }
        else {
          if ((comp->blockLevel != -1) ||
             ((nodeType - 3U < 0xfffffffe && ((pxVar3->flags & 0x4000) == 0)))) goto LAB_0016b828;
          iVar9 = comp->nbState;
          if (0 < iVar9) {
            uVar7 = pxVar3->flags;
            iVar17 = 0;
            do {
              piVar4 = comp->states;
              if ((uVar7 >> 0x10 & 1) == 0) {
                iVar8 = comp->level;
                if (piVar4[comp->nbState * 2 + -1] < iVar8) {
                  return -1;
                }
                iVar16 = piVar4[comp->nbState * 2 + -2];
                pxVar10 = pxVar3->steps;
                iVar17 = iVar9;
LAB_0016b608:
                uVar1 = pxVar10[iVar16].flags;
                iVar2 = pxVar10[iVar16].nodeType;
                if (iVar2 == nodeType) {
                  if (nodeType == 100) {
LAB_0016b746:
                    bVar15 = 0;
                    uVar14 = uVar1 & 2;
                    uVar11 = 1;
                    if (uVar14 == 0) {
                      xmlStreamCtxtAddState(comp,iVar16 + 1,comp->level + 1);
                      if (uVar18 == 1) {
                        uVar14 = 0;
                        bVar15 = 0;
                        uVar11 = 1;
                      }
                      else {
                        bVar15 = 0;
                        uVar14 = 0;
                        uVar11 = uVar1 >> 5 & 1;
                      }
                    }
                  }
                  else {
                    pxVar5 = pxVar10[iVar16].name;
                    pxVar6 = pxVar10[iVar16].ns;
                    uVar11 = uVar18;
                    if (pxVar5 == (xmlChar *)0x0) {
                      if (pxVar6 != (xmlChar *)0x0) {
                        if (ns == (xmlChar *)0x0) goto LAB_0016b78a;
LAB_0016b729:
                        iVar8 = xmlStrEqual(pxVar6,ns);
                        if (iVar8 == 0) goto LAB_0016b7cc;
                      }
                      goto LAB_0016b746;
                    }
                    if (((name == (xmlChar *)0x0) ||
                        ((ns == (xmlChar *)0x0) == (pxVar6 != (xmlChar *)0x0))) ||
                       (*pxVar5 != *name)) {
LAB_0016b78a:
                      bVar15 = 1;
                    }
                    else {
                      iVar8 = xmlStrEqual(pxVar5,name);
                      if (iVar8 != 0) {
                        if (pxVar6 != ns) goto LAB_0016b729;
                        goto LAB_0016b746;
                      }
LAB_0016b7cc:
                      bVar15 = 1;
                    }
                  }
                  uVar7 = pxVar3->flags;
                  uVar18 = uVar11;
                  if ((uVar7 >> 0x10 & 1) == 0) {
                    if ((bool)(bVar15 | uVar14 != 0)) {
                      iVar8 = comp->level;
                      goto LAB_0016b7ef;
                    }
                    uVar14 = 0;
                  }
                }
                else {
                  if (iVar2 == 100) goto LAB_0016b746;
                  if ((iVar2 != 2) || ((uVar7 >> 0x10 & 1) != 0)) goto LAB_0016b803;
LAB_0016b7ef:
                  comp->blockLevel = iVar8 + 1;
                }
              }
              else {
                iVar16 = piVar4[(uint)(iVar17 * 2)];
                if (-1 < (long)iVar16) {
                  iVar8 = comp->level;
                  if ((piVar4[(ulong)(uint)(iVar17 * 2) + 1] <= iVar8) &&
                     ((pxVar10 = pxVar3->steps, iVar8 <= piVar4[(ulong)(uint)(iVar17 * 2) + 1] ||
                      ((pxVar10[iVar16].flags & 1U) != 0)))) goto LAB_0016b608;
                }
              }
LAB_0016b803:
              iVar17 = iVar17 + 1;
            } while (iVar17 < iVar9);
          }
          iVar9 = comp->level;
          iVar17 = iVar9 + 1;
          comp->level = iVar17;
          pxVar10 = pxVar3->steps;
          uVar7 = pxVar10->flags;
          if ((uVar7 & 4) != 0) goto LAB_0016b55f;
          pxVar5 = pxVar10->name;
          pxVar6 = pxVar10->ns;
          uVar1 = comp->flags;
          if ((uVar1 & 7) == 0) {
LAB_0016b88d:
            if (pxVar10->nodeType == nodeType) {
              if (nodeType == 100) {
LAB_0016b935:
                uVar14 = uVar7 & 2;
                bVar15 = 0;
                if (uVar14 == 0) {
                  xmlStreamCtxtAddState(comp,1,comp->level);
                  if (uVar18 == 1) {
                    uVar14 = 0;
                    uVar18 = 1;
                  }
                  else {
                    uVar18 = uVar7 >> 5 & 1;
                    uVar14 = 0;
                    bVar15 = 0;
                  }
                }
                else {
                  uVar18 = 1;
                  bVar15 = 0;
                }
              }
              else {
                if (pxVar5 == (xmlChar *)0x0) {
                  if (pxVar6 != (xmlChar *)0x0) {
                    if (ns == (xmlChar *)0x0) goto LAB_0016b9fe;
                    iVar9 = xmlStrEqual(pxVar6,ns);
                    uVar14 = uVar7 & 2;
                    if (iVar9 == 0) {
                      bVar15 = 1;
                      goto LAB_0016ba08;
                    }
                  }
                  goto LAB_0016b935;
                }
                if ((((name != (xmlChar *)0x0) &&
                     ((ns == (xmlChar *)0x0) != (pxVar6 != (xmlChar *)0x0))) &&
                    ((*pxVar5 == *name && (iVar9 = xmlStrEqual(pxVar5,name), iVar9 != 0)))) &&
                   ((pxVar6 == ns || (iVar9 = xmlStrEqual(pxVar6,ns), iVar9 != 0))))
                goto LAB_0016b935;
LAB_0016b9fe:
                uVar14 = uVar7 & 2;
                bVar15 = 1;
              }
LAB_0016ba08:
              if ((pxVar3->flags & 0x10000) == 0) {
                if ((bool)(~bVar15 & uVar14 == 0)) {
                  uVar14 = 0;
                }
                else {
                  comp->blockLevel = comp->level;
                }
              }
            }
            else if ((nodeType != 2) && (pxVar10->nodeType == 100)) goto LAB_0016b935;
          }
          else if (iVar9 == 0) {
            if ((uVar1 & 6) == 0) goto LAB_0016b88d;
          }
          else if (((uVar7 & 1) != 0) || ((uVar1 & 6) != 0 && iVar17 == 2)) goto LAB_0016b88d;
        }
LAB_0016b55f:
        comp = comp->next;
        if (comp == (_xmlStreamCtxt *)0x0) goto LAB_0016bae3;
      }
      stream->nbState = 0;
      stream->level = 0;
      stream->blockLevel = -1;
      if ((pxVar3->flags & 0x8000) != 0) {
        if (pxVar3->nbStep == 0) {
LAB_0016ba80:
          uVar13 = 1;
        }
        else {
          if (pxVar3->nbStep == 1) {
            pxVar10 = pxVar3->steps;
            if ((pxVar10->nodeType == 100) && ((pxVar10->flags & 1) != 0)) goto LAB_0016ba80;
          }
          else {
            pxVar10 = pxVar3->steps;
          }
          if ((pxVar10->flags & 4) != 0) {
            iVar9 = xmlStreamCtxtAddState(stream,0,0);
            iVar12 = iVar12 - (iVar9 >> 0x1f);
          }
        }
      }
      stream = stream->next;
      uVar18 = uVar13;
    } while (stream != (_xmlStreamCtxt *)0x0);
LAB_0016bae3:
    uVar13 = 0xffffffff;
    if (iVar12 < 1) {
      uVar13 = uVar18;
    }
  }
  return uVar13;
}

Assistant:

static int
xmlStreamPushInternal(xmlStreamCtxtPtr stream,
		      const xmlChar *name, const xmlChar *ns,
		      int nodeType) {
    int ret = 0, err = 0, final = 0, tmp, i, m, match, stepNr, desc;
    xmlStreamCompPtr comp;
    xmlStreamStep step;
#ifdef DEBUG_STREAMING
    xmlStreamCtxtPtr orig = stream;
#endif

    if ((stream == NULL) || (stream->nbState < 0))
        return(-1);

    while (stream != NULL) {
	comp = stream->comp;

	if ((nodeType == XML_ELEMENT_NODE) &&
	    (name == NULL) && (ns == NULL)) {
	    /* We have a document node here (or a reset). */
	    stream->nbState = 0;
	    stream->level = 0;
	    stream->blockLevel = -1;
	    if (comp->flags & XML_STREAM_FROM_ROOT) {
		if (comp->nbStep == 0) {
		    /* TODO: We have a "/." here? */
		    ret = 1;
		} else {
		    if ((comp->nbStep == 1) &&
			(comp->steps[0].nodeType == XML_STREAM_ANY_NODE) &&
			(comp->steps[0].flags & XML_STREAM_STEP_DESC))
		    {
			/*
			* In the case of "//." the document node will match
			* as well.
			*/
			ret = 1;
		    } else if (comp->steps[0].flags & XML_STREAM_STEP_ROOT) {
			/* TODO: Do we need this ? */
			tmp = xmlStreamCtxtAddState(stream, 0, 0);
			if (tmp < 0)
			    err++;
		    }
		}
	    }
	    stream = stream->next;
	    continue; /* while */
	}

	/*
	* Fast check for ".".
	*/
	if (comp->nbStep == 0) {
	    /*
	     * / and . are handled at the XPath node set creation
	     * level by checking min depth
	     */
	    if (stream->flags & XML_PATTERN_XPATH) {
		stream = stream->next;
		continue; /* while */
	    }
	    /*
	    * For non-pattern like evaluation like XML Schema IDCs
	    * or traditional XPath expressions, this will match if
	    * we are at the first level only, otherwise on every level.
	    */
	    if ((nodeType != XML_ATTRIBUTE_NODE) &&
		(((stream->flags & XML_PATTERN_NOTPATTERN) == 0) ||
		(stream->level == 0))) {
		    ret = 1;
	    }
	    stream->level++;
	    goto stream_next;
	}
	if (stream->blockLevel != -1) {
	    /*
	    * Skip blocked expressions.
	    */
	    stream->level++;
	    goto stream_next;
	}

	if ((nodeType != XML_ELEMENT_NODE) &&
	    (nodeType != XML_ATTRIBUTE_NODE) &&
	    ((comp->flags & XML_STREAM_FINAL_IS_ANY_NODE) == 0)) {
	    /*
	    * No need to process nodes of other types if we don't
	    * resolve to those types.
	    * TODO: Do we need to block the context here?
	    */
	    stream->level++;
	    goto stream_next;
	}

	/*
	 * Check evolution of existing states
	 */
	i = 0;
	m = stream->nbState;
	while (i < m) {
	    if ((comp->flags & XML_STREAM_DESC) == 0) {
		/*
		* If there is no "//", then only the last
		* added state is of interest.
		*/
		stepNr = stream->states[2 * (stream->nbState -1)];
		/*
		* TODO: Security check, should not happen, remove it.
		*/
		if (stream->states[(2 * (stream->nbState -1)) + 1] <
		    stream->level) {
		    return (-1);
		}
		desc = 0;
		/* loop-stopper */
		i = m;
	    } else {
		/*
		* If there are "//", then we need to process every "//"
		* occurring in the states, plus any other state for this
		* level.
		*/
		stepNr = stream->states[2 * i];

		/* TODO: should not happen anymore: dead states */
		if (stepNr < 0)
		    goto next_state;

		tmp = stream->states[(2 * i) + 1];

		/* skip new states just added */
		if (tmp > stream->level)
		    goto next_state;

		/* skip states at ancestor levels, except if "//" */
		desc = comp->steps[stepNr].flags & XML_STREAM_STEP_DESC;
		if ((tmp < stream->level) && (!desc))
		    goto next_state;
	    }
	    /*
	    * Check for correct node-type.
	    */
	    step = comp->steps[stepNr];
	    if (step.nodeType != nodeType) {
		if (step.nodeType == XML_ATTRIBUTE_NODE) {
		    /*
		    * Block this expression for deeper evaluation.
		    */
		    if ((comp->flags & XML_STREAM_DESC) == 0)
			stream->blockLevel = stream->level +1;
		    goto next_state;
		} else if (step.nodeType != XML_STREAM_ANY_NODE)
		    goto next_state;
	    }
	    /*
	    * Compare local/namespace-name.
	    */
	    match = 0;
	    if (step.nodeType == XML_STREAM_ANY_NODE) {
		match = 1;
	    } else if (step.name == NULL) {
		if (step.ns == NULL) {
		    /*
		    * This lets through all elements/attributes.
		    */
		    match = 1;
		} else if (ns != NULL)
		    match = xmlStrEqual(step.ns, ns);
	    } else if (((step.ns != NULL) == (ns != NULL)) &&
		(name != NULL) &&
		(step.name[0] == name[0]) &&
		xmlStrEqual(step.name, name) &&
		((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	    {
		match = 1;
	    }
#if 0
/*
* TODO: Pointer comparison won't work, since not guaranteed that the given
*  values are in the same dict; especially if it's the namespace name,
*  normally coming from ns->href. We need a namespace dict mechanism !
*/
	    } else if (comp->dict) {
		if (step.name == NULL) {
		    if (step.ns == NULL)
			match = 1;
		    else
			match = (step.ns == ns);
		} else {
		    match = ((step.name == name) && (step.ns == ns));
		}
#endif /* if 0 ------------------------------------------------------- */
	    if (match) {
		final = step.flags & XML_STREAM_STEP_FINAL;
		if (desc) {
		    if (final) {
			ret = 1;
		    } else {
			/* descending match create a new state */
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		} else {
		    if (final) {
			ret = 1;
		    } else {
			xmlStreamCtxtAddState(stream, stepNr + 1,
			                      stream->level + 1);
		    }
		}
		if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		    /*
		    * Check if we have a special case like "foo/bar//.", where
		    * "foo" is selected as well.
		    */
		    ret = 1;
		}
	    }
	    if (((comp->flags & XML_STREAM_DESC) == 0) &&
		((! match) || final))  {
		/*
		* Mark this expression as blocked for any evaluation at
		* deeper levels. Note that this includes "/foo"
		* expressions if the *pattern* behaviour is used.
		*/
		stream->blockLevel = stream->level +1;
	    }
next_state:
	    i++;
	}

	stream->level++;

	/*
	* Re/enter the expression.
	* Don't reenter if it's an absolute expression like "/foo",
	*   except "//foo".
	*/
	step = comp->steps[0];
	if (step.flags & XML_STREAM_STEP_ROOT)
	    goto stream_next;

	desc = step.flags & XML_STREAM_STEP_DESC;
	if (stream->flags & XML_PATTERN_NOTPATTERN) {
	    /*
	    * Re/enter the expression if it is a "descendant" one,
	    * or if we are at the 1st level of evaluation.
	    */

	    if (stream->level == 1) {
		if (XML_STREAM_XS_IDC(stream)) {
		    /*
		    * XS-IDC: The missing "self::node()" will always
		    * match the first given node.
		    */
		    goto stream_next;
		} else
		    goto compare;
	    }
	    /*
	    * A "//" is always reentrant.
	    */
	    if (desc)
		goto compare;

	    /*
	    * XS-IDC: Process the 2nd level, since the missing
	    * "self::node()" is responsible for the 2nd level being
	    * the real start level.
	    */
	    if ((stream->level == 2) && XML_STREAM_XS_IDC(stream))
		goto compare;

	    goto stream_next;
	}

compare:
	/*
	* Check expected node-type.
	*/
	if (step.nodeType != nodeType) {
	    if (nodeType == XML_ATTRIBUTE_NODE)
		goto stream_next;
	    else if (step.nodeType != XML_STREAM_ANY_NODE)
		goto stream_next;
	}
	/*
	* Compare local/namespace-name.
	*/
	match = 0;
	if (step.nodeType == XML_STREAM_ANY_NODE) {
	    match = 1;
	} else if (step.name == NULL) {
	    if (step.ns == NULL) {
		/*
		* This lets through all elements/attributes.
		*/
		match = 1;
	    } else if (ns != NULL)
		match = xmlStrEqual(step.ns, ns);
	} else if (((step.ns != NULL) == (ns != NULL)) &&
	    (name != NULL) &&
	    (step.name[0] == name[0]) &&
	    xmlStrEqual(step.name, name) &&
	    ((step.ns == ns) || xmlStrEqual(step.ns, ns)))
	{
	    match = 1;
	}
	final = step.flags & XML_STREAM_STEP_FINAL;
	if (match) {
	    if (final)
		ret = 1;
	    else
		xmlStreamCtxtAddState(stream, 1, stream->level);
	    if ((ret != 1) && (step.flags & XML_STREAM_STEP_IN_SET)) {
		/*
		* Check if we have a special case like "foo//.", where
		* "foo" is selected as well.
		*/
		ret = 1;
	    }
	}
	if (((comp->flags & XML_STREAM_DESC) == 0) &&
	    ((! match) || final))  {
	    /*
	    * Mark this expression as blocked for any evaluation at
	    * deeper levels.
	    */
	    stream->blockLevel = stream->level;
	}

stream_next:
        stream = stream->next;
    } /* while stream != NULL */

    if (err > 0)
        ret = -1;
#ifdef DEBUG_STREAMING
    xmlDebugStreamCtxt(orig, ret);
#endif
    return(ret);
}